

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O3

Vec_Int_t * Gia_ManFindLatest(Gia_Man_t *p,int LevelMax,int nTimeWindow)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  void *__ptr;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  size_t sVar16;
  
  uVar9 = (ulong)(uint)LevelMax;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(4000);
  p_00->pArray = piVar5;
  pVVar6 = p->vMapping;
  if (pVVar6 == (Vec_Int_t *)0x0) {
    uVar4 = Gia_ManLevelNum(p);
    if (nTimeWindow != 0) {
      uVar9 = (ulong)(uint)(int)((double)(int)uVar4 * ((double)nTimeWindow * -0.01 + 1.0));
    }
    if ((int)uVar4 < (int)uVar9) {
      printf("The maximum AIG level (%d) is less than the target level (%d).\n",(ulong)uVar4,uVar9);
    }
    pVVar6 = p->vCos;
    if (0 < pVVar6->nSize) {
      lVar15 = 0;
      do {
        uVar4 = pVVar6->pArray[lVar15];
        if (((int)uVar4 < 0) || (p->nObjs <= (int)uVar4)) goto LAB_0070d58c;
        if (p->pObjs == (Gia_Obj_t *)0x0) {
          return p_00;
        }
        pVVar6 = p->vLevels;
        uVar11 = pVVar6->nSize;
        if ((int)uVar4 < (int)uVar11) {
          if (uVar11 <= uVar4) goto LAB_0070d5ab;
        }
        else {
          lVar1 = (ulong)uVar4 + 1;
          uVar3 = pVVar6->nCap * 2;
          uVar8 = (uint)lVar1;
          if ((int)uVar4 < (int)uVar3) {
            if (pVVar6->nCap <= (int)uVar4) {
              if (pVVar6->pArray == (int *)0x0) {
                piVar5 = (int *)malloc((ulong)uVar3 << 2);
              }
              else {
                piVar5 = (int *)realloc(pVVar6->pArray,(ulong)uVar3 << 2);
              }
              pVVar6->pArray = piVar5;
              goto joined_r0x0070d4f4;
            }
          }
          else {
            sVar16 = lVar1 * 4;
            if (pVVar6->pArray == (int *)0x0) {
              piVar5 = (int *)malloc(sVar16);
            }
            else {
              piVar5 = (int *)realloc(pVVar6->pArray,sVar16);
            }
            pVVar6->pArray = piVar5;
            uVar3 = uVar8;
joined_r0x0070d4f4:
            if (piVar5 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            pVVar6->nCap = uVar3;
            uVar11 = pVVar6->nSize;
          }
          if ((int)uVar11 <= (int)uVar4) {
            memset(pVVar6->pArray + (int)uVar11,0,(ulong)(uVar4 - uVar11) * 4 + 4);
          }
          pVVar6->nSize = uVar8;
        }
        if ((int)uVar9 <= pVVar6->pArray[uVar4]) {
          Vec_IntPush(p_00,(int)lVar15);
        }
        lVar15 = lVar15 + 1;
        pVVar6 = p->vCos;
      } while (lVar15 < pVVar6->nSize);
    }
  }
  else {
    sVar16 = (size_t)p->nObjs;
    __ptr = calloc(sVar16,4);
    uVar9 = 0;
    if (1 < (long)sVar16) {
      uVar4 = pVVar6->nSize;
      uVar7 = 1;
      if (1 < (int)uVar4) {
        uVar7 = (ulong)uVar4;
      }
      uVar10 = 1;
      uVar9 = 0;
      do {
        if (uVar10 == uVar7) {
LAB_0070d5ab:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar5 = pVVar6->pArray;
        uVar11 = piVar5[uVar10];
        uVar13 = (ulong)uVar11;
        if (uVar13 != 0) {
          if (((int)uVar11 < 0) || (uVar4 <= uVar11)) goto LAB_0070d5ab;
          uVar11 = piVar5[uVar13];
          uVar3 = uVar11;
          if ((int)uVar11 < 1) {
            uVar3 = 0;
          }
          if (0 < (int)uVar11) {
            iVar12 = *(int *)((long)__ptr + uVar10 * 4);
            uVar14 = 0;
            do {
              iVar2 = *(int *)((long)__ptr + (long)piVar5[uVar13 + uVar14 + 1] * 4);
              if (iVar12 <= iVar2) {
                iVar12 = iVar2;
              }
              *(int *)((long)__ptr + uVar10 * 4) = iVar12;
              uVar14 = uVar14 + 1;
            } while (uVar3 != uVar14);
          }
          uVar11 = *(int *)((long)__ptr + uVar10 * 4) + 1;
          *(uint *)((long)__ptr + uVar10 * 4) = uVar11;
          if ((int)uVar9 <= (int)uVar11) {
            uVar9 = (ulong)uVar11;
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != sVar16);
    }
    if (nTimeWindow != 0) {
      LevelMax = (int)((double)(int)uVar9 * ((double)nTimeWindow * -0.01 + 1.0));
    }
    if ((int)uVar9 < LevelMax) {
      printf("The maximum mapped level (%d) is less than the target level (%d).\n",uVar9,
             (ulong)(uint)LevelMax);
    }
    pVVar6 = p->vCos;
    if (pVVar6->nSize < 1) {
LAB_0070d3e9:
      if (__ptr == (void *)0x0) {
        return p_00;
      }
    }
    else {
      lVar15 = 0;
      do {
        iVar12 = pVVar6->pArray[lVar15];
        if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) {
LAB_0070d58c:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_0070d3e9;
        if (LevelMax <=
            *(int *)((long)__ptr +
                    (long)(int)(iVar12 - (*(uint *)(p->pObjs + iVar12) & 0x1fffffff)) * 4)) {
          Vec_IntPush(p_00,(int)lVar15);
          pVVar6 = p->vCos;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < pVVar6->nSize);
    }
    free(__ptr);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManFindLatest( Gia_Man_t * p, int LevelMax, int nTimeWindow )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vOuts;
    vOuts = Vec_IntAlloc( 1000 );
    if ( Gia_ManHasMapping(p) )
    {
        int i, k, iFan, nLevels = 0;
        int * pLevels = ABC_CALLOC( int, Gia_ManObjNum(p) );
        Gia_ManForEachLut( p, i )
        {
            Gia_LutForEachFanin( p, i, iFan, k )
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[iFan] );
            pLevels[i]++;
            nLevels = Abc_MaxInt( nLevels, pLevels[i] );
        }
        if ( nTimeWindow )
            LevelMax = (int)((1.0 - 0.01 * nTimeWindow) * nLevels);
        if ( nLevels < LevelMax )
            printf( "The maximum mapped level (%d) is less than the target level (%d).\n", nLevels, LevelMax );
        Gia_ManForEachCo( p, pObj, i )
            if ( pLevels[Gia_ObjFaninId0p(p, pObj)] >= LevelMax )
                Vec_IntPush( vOuts, i );
        ABC_FREE( pLevels );
    }
    else
    {
        int i, nLevels = Gia_ManLevelNum( p );
        if ( nTimeWindow )
            LevelMax = (int)((1.0 - 0.01 * nTimeWindow) * nLevels);
        if ( nLevels < LevelMax )
            printf( "The maximum AIG level (%d) is less than the target level (%d).\n", nLevels, LevelMax );
        Gia_ManForEachCo( p, pObj, i )
            if ( Gia_ObjLevel(p, pObj) >= LevelMax )
                Vec_IntPush( vOuts, i );
    }
    return vOuts;
}